

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O0

void __thiscall Pyraminx::Pyraminx(Pyraminx *this)

{
  undefined1 local_dc [24];
  undefined1 local_c4 [24];
  undefined1 local_ac [24];
  undefined1 local_94 [36];
  undefined1 local_70 [8];
  Eq_Pos_Table eq_pos_table;
  Pyraminx *this_local;
  
  eq_pos_table.green_eq.
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::vector
            (&this->face_list);
  std::shared_ptr<Face>::shared_ptr(&this->blue_face);
  std::shared_ptr<Face>::shared_ptr(&this->red_face);
  std::shared_ptr<Face>::shared_ptr(&this->yellow_face);
  std::shared_ptr<Face>::shared_ptr(&this->green_face);
  Eq_Pos_Table::Eq_Pos_Table((Eq_Pos_Table *)local_70);
  local_94._0_4_ = 1;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_94 + 4),(Eq_Pos_Table *)local_94);
  std::shared_ptr<Face>::operator=(&this->blue_face,(shared_ptr<Face> *)(local_94 + 4));
  std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)(local_94 + 4));
  local_ac._0_4_ = 3;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_ac + 4),(Eq_Pos_Table *)local_ac);
  std::shared_ptr<Face>::operator=(&this->red_face,(shared_ptr<Face> *)(local_ac + 4));
  std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)(local_ac + 4));
  local_c4._0_4_ = 2;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_c4 + 4),(Eq_Pos_Table *)local_c4);
  std::shared_ptr<Face>::operator=(&this->yellow_face,(shared_ptr<Face> *)(local_c4 + 4));
  std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)(local_c4 + 4));
  local_dc._0_4_ = 0;
  std::make_shared<Face,Color,Eq_Pos_Table&>((Color *)(local_dc + 4),(Eq_Pos_Table *)local_dc);
  std::shared_ptr<Face>::operator=(&this->green_face,(shared_ptr<Face> *)(local_dc + 4));
  std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)(local_dc + 4));
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->blue_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->red_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->yellow_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->green_face);
  set_neighbors(this);
  Eq_Pos_Table::~Eq_Pos_Table((Eq_Pos_Table *)local_70);
  return;
}

Assistant:

Pyraminx::Pyraminx(){
    Eq_Pos_Table eq_pos_table;

    blue_face = std::make_shared<Face>(Color::blue, eq_pos_table);
    red_face = std::make_shared<Face>(Color::red, eq_pos_table);
    yellow_face = std::make_shared<Face>(Color::yellow, eq_pos_table);
    green_face = std::make_shared<Face>(Color::green, eq_pos_table);

    face_list.push_back(blue_face);
    face_list.push_back(red_face);
    face_list.push_back(yellow_face);
    face_list.push_back(green_face); 
   set_neighbors();
}